

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffc2ll(char *cval,int *lval,int *status)

{
  if (0 < *status) {
    return *status;
  }
  *lval = (uint)(*cval == 'T');
  return *status;
}

Assistant:

int ffc2ll(const char *cval,  /* I - string representation of the value: T or F */
           int *lval,         /* O - numerical value of the input string: 1 or 0 */
           int *status)       /* IO - error status */
/*
  convert null-terminated formatted string to a logical value
*/
{
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (cval[0] == 'T')
        *lval = 1;
    else                
        *lval = 0;        /* any character besides T is considered false */

    return(*status);
}